

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_mdef.c
# Opt level: O1

bin_mdef_t * bin_mdef_read(ps_config_t *config,char *filename)

{
  int32 *piVar1;
  mdef_entry_t *pmVar2;
  ushort *puVar3;
  ushort uVar4;
  char *pcVar5;
  cd_tree_t *pcVar6;
  cd_tree_t *pcVar7;
  uint16 *puVar8;
  int16 *piVar9;
  int32 iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  bin_mdef_t *pbVar15;
  FILE *__stream;
  size_t sVar16;
  char **ppcVar17;
  mmio_file_t *pmVar18;
  long lVar19;
  long lVar20;
  char *pcVar21;
  void *pvVar22;
  uint16 **ppuVar23;
  int16 *piVar24;
  ulong uVar25;
  long lVar26;
  size_t size;
  int *piVar27;
  int32 *piVar28;
  bool bVar29;
  int32 val;
  int32 *local_60;
  int32 *local_58;
  int32 *local_50;
  int32 *local_48;
  int32 *local_40;
  int32 *local_38;
  
  pbVar15 = bin_mdef_read_text(config,filename);
  if (pbVar15 != (bin_mdef_t *)0x0) {
    return pbVar15;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
          ,0x150,"Reading binary model definition: %s\n",filename);
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    return (bin_mdef_t *)0x0;
  }
  sVar16 = fread(&val,4,1,__stream);
  iVar10 = val;
  if (sVar16 == 1) {
    if (val == 0x424d4446) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
              ,0x15d,"Must byte-swap %s\n",filename);
    }
    sVar16 = fread(&val,4,1,__stream);
    if (sVar16 == 1) {
      if (iVar10 == 0x424d4446) {
        val = (uint)val >> 0x18 | (val & 0xff0000U) >> 8 | (val & 0xff00U) << 8 | val << 0x18;
      }
      if (1 < val) {
        pbVar15 = (bin_mdef_t *)0x0;
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                ,0x168,"File format version %d for %s is newer than library\n",(ulong)(uint)val,
                filename);
LAB_00120446:
        fclose(__stream);
        return pbVar15;
      }
      sVar16 = fread(&val,4,1,__stream);
      if (sVar16 == 1) {
        if (iVar10 == 0x424d4446) {
          val = (uint)val >> 0x18 | (val & 0xff0000U) >> 8 | (val & 0xff00U) << 8 | val << 0x18;
        }
        fseek(__stream,(long)val,1);
        pbVar15 = (bin_mdef_t *)
                  __ckd_calloc__(1,0x78,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                 ,0x177);
        pbVar15->refcnt = 1;
        piVar28 = &pbVar15->n_ciphone;
        sVar16 = fread(piVar28,4,1,__stream);
        if (sVar16 == 1) {
          if (iVar10 == 0x424d4446) {
            uVar12 = *piVar28;
            *piVar28 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                       uVar12 << 0x18;
          }
          piVar1 = &pbVar15->n_phone;
          local_60 = piVar28;
          sVar16 = fread(piVar1,4,1,__stream);
          if (sVar16 == 1) {
            if (iVar10 == 0x424d4446) {
              uVar12 = *piVar1;
              *piVar1 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                        uVar12 << 0x18;
            }
            local_48 = &pbVar15->n_emit_state;
            sVar16 = fread(local_48,4,1,__stream);
            if (sVar16 == 1) {
              if (iVar10 == 0x424d4446) {
                uVar12 = *local_48;
                *local_48 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                            uVar12 << 0x18;
              }
              piVar28 = &pbVar15->n_ci_sen;
              local_58 = piVar1;
              sVar16 = fread(piVar28,4,1,__stream);
              if (sVar16 == 1) {
                if (iVar10 == 0x424d4446) {
                  uVar12 = *piVar28;
                  *piVar28 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                             uVar12 << 0x18;
                }
                piVar28 = &pbVar15->n_sen;
                sVar16 = fread(piVar28,4,1,__stream);
                if (sVar16 == 1) {
                  if (iVar10 == 0x424d4446) {
                    uVar12 = *piVar28;
                    *piVar28 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                               uVar12 << 0x18;
                  }
                  piVar1 = &pbVar15->n_tmat;
                  local_50 = piVar28;
                  sVar16 = fread(piVar1,4,1,__stream);
                  if (sVar16 == 1) {
                    if (iVar10 == 0x424d4446) {
                      uVar12 = *piVar1;
                      *piVar1 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                                uVar12 << 0x18;
                    }
                    piVar28 = &pbVar15->n_sseq;
                    sVar16 = fread(piVar28,4,1,__stream);
                    if (sVar16 == 1) {
                      if (iVar10 == 0x424d4446) {
                        uVar12 = *piVar28;
                        *piVar28 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                   (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
                      }
                      piVar1 = &pbVar15->n_ctx;
                      local_38 = piVar28;
                      sVar16 = fread(piVar1,4,1,__stream);
                      if (sVar16 == 1) {
                        if (iVar10 == 0x424d4446) {
                          uVar12 = *piVar1;
                          *piVar1 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                    (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
                        }
                        local_40 = &pbVar15->n_cd_tree;
                        sVar16 = fread(local_40,4,1,__stream);
                        if (sVar16 == 1) {
                          if (iVar10 == 0x424d4446) {
                            uVar12 = *local_40;
                            *local_40 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                        (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
                          }
                          piVar28 = &pbVar15->sil;
                          sVar16 = fread(piVar28,4,1,__stream);
                          if (sVar16 == 1) {
                            if (iVar10 == 0x424d4446) {
                              uVar12 = *piVar28;
                              *piVar28 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                         (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
                            }
                            ppcVar17 = (char **)__ckd_calloc__((long)pbVar15->n_ciphone,8,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                                  ,400);
                            pbVar15->ciname = ppcVar17;
                            if (config == (ps_config_t *)0x0) {
                              iVar11 = 1;
                            }
                            else {
                              iVar11 = ps_config_bool(config,"mmap");
                            }
                            if (iVar10 == 0x424d4446) {
                              iVar11 = 0;
                              err_msg(ERR_WARN,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                      ,0x195,
                                      "-mmap specified, but mdef is other-endian.  Will not memory-map.\n"
                                     );
                            }
                            if (iVar11 == 0) {
                              bVar29 = true;
                            }
                            else {
                              pmVar18 = mmio_file_read(filename);
                              pbVar15->filemap = pmVar18;
                              bVar29 = pmVar18 == (mmio_file_t *)0x0;
                            }
                            lVar19 = ftell(__stream);
                            if (bVar29) {
                              pbVar15->alloc_mode = BIN_MDEF_IN_MEMORY;
                              fseek(__stream,0,2);
                              lVar20 = ftell(__stream);
                              fseek(__stream,lVar19,0);
                              size = lVar20 - lVar19;
                              pcVar21 = (char *)__ckd_malloc__(size,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                                  ,0x1ab);
                              *pbVar15->ciname = pcVar21;
                              sVar16 = fread(*pbVar15->ciname,1,size,__stream);
                              if (sVar16 != size) {
                                err_msg(ERR_FATAL,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                        ,0x1ad,"Failed to read %d bytes of data from %s\n",size,
                                        filename);
                                exit(1);
                              }
                            }
                            else {
                              pvVar22 = mmio_file_ptr(pbVar15->filemap);
                              *pbVar15->ciname = (char *)((long)pvVar22 + lVar19);
                              pbVar15->alloc_mode = BIN_MDEF_ON_DISK;
                            }
                            local_60 = (int32 *)(long)*local_60;
                            piVar27 = (int *)&DAT_00000001;
                            if (1 < (long)local_60) {
                              do {
                                ppcVar17 = pbVar15->ciname;
                                pcVar21 = ppcVar17[(long)((long)piVar27 + -1)];
                                sVar16 = strlen(pcVar21);
                                ppcVar17[(long)piVar27] = pcVar21 + sVar16 + 1;
                                piVar27 = (int *)((long)piVar27 + 1);
                              } while (local_60 != piVar27);
                            }
                            ppcVar17 = pbVar15->ciname;
                            pcVar21 = ppcVar17[(long)((long)piVar27 + -1)];
                            sVar16 = strlen(pcVar21);
                            pcVar5 = *ppcVar17;
                            pbVar15->cd_tree =
                                 (cd_tree_t *)
                                 (pcVar5 + ((ulong)(pcVar21 + (sVar16 - (long)pcVar5) + 4) &
                                           0xfffffffffffffffc));
                            if ((iVar10 == 0x424d4446) && (0 < *local_40)) {
                              lVar19 = 0;
                              do {
                                pcVar6 = pbVar15->cd_tree;
                                pcVar7 = pcVar6 + lVar19;
                                pcVar7->ctx = pcVar7->ctx << 8 | (ushort)pcVar7->ctx >> 8;
                                piVar24 = &pcVar6[lVar19].n_down;
                                *piVar24 = *piVar24 << 8 | (ushort)*piVar24 >> 8;
                                uVar12 = pcVar6[lVar19].c.pid;
                                pcVar6[lVar19].c.pid =
                                     uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                     (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
                                lVar19 = lVar19 + 1;
                              } while (lVar19 < pbVar15->n_cd_tree);
                            }
                            pcVar7 = pbVar15->cd_tree;
                            iVar11 = pbVar15->n_cd_tree;
                            pbVar15->phone = (mdef_entry_t *)(pcVar7 + iVar11);
                            if ((iVar10 == 0x424d4446) && (iVar14 = *local_58, 0 < (long)iVar14)) {
                              lVar19 = 0;
                              do {
                                uVar12 = *(uint *)((long)&pcVar7[iVar11].ctx + lVar19);
                                uVar13 = *(uint *)((long)&pcVar7[iVar11].c + lVar19);
                                *(uint *)((long)&pcVar7[iVar11].ctx + lVar19) =
                                     uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                     (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
                                *(uint *)((long)&pcVar7[iVar11].c + lVar19) =
                                     uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 |
                                     (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
                                lVar19 = lVar19 + 0xc;
                              } while ((long)iVar14 * 0xc != lVar19);
                            }
                            pmVar2 = (mdef_entry_t *)(pcVar7 + iVar11) + *local_58;
                            if (iVar10 == 0x424d4446) {
                              uVar12 = pmVar2->ssid;
                              pmVar2->ssid = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                             (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
                            }
                            ppuVar23 = (uint16 **)
                                       __ckd_calloc__((long)pbVar15->n_sseq,8,
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                                  ,0x1c9);
                            pbVar15->sseq = ppuVar23;
                            *ppuVar23 = (uint16 *)&pmVar2->tmat;
                            if ((iVar10 == 0x424d4446) && (iVar11 = pmVar2->ssid, 0 < (long)iVar11))
                            {
                              puVar8 = *pbVar15->sseq;
                              lVar19 = 0;
                              do {
                                puVar3 = puVar8 + lVar19;
                                *puVar3 = *puVar3 << 8 | *puVar3 >> 8;
                                lVar19 = lVar19 + 1;
                              } while (iVar11 != lVar19);
                            }
                            if ((long)*local_48 == 0) {
                              pbVar15->sseq_len = (uint8 *)(*pbVar15->sseq + pmVar2->ssid);
                              iVar11 = pbVar15->n_sseq;
                              if (1 < (long)iVar11) {
                                lVar19 = 0;
                                do {
                                  pbVar15->sseq[lVar19 + 1] =
                                       (uint16 *)
                                       ((ulong)((uint)pbVar15->sseq_len[lVar19] * 2) +
                                       (long)pbVar15->sseq[lVar19]);
                                  lVar19 = lVar19 + 1;
                                } while ((long)iVar11 + -1 != lVar19);
                              }
                            }
                            else {
                              iVar11 = *local_38;
                              if (1 < (long)iVar11) {
                                lVar19 = (long)*local_48 * 2;
                                lVar26 = 1;
                                lVar20 = lVar19;
                                do {
                                  pbVar15->sseq[lVar26] = (uint16 *)((long)*pbVar15->sseq + lVar20);
                                  lVar26 = lVar26 + 1;
                                  lVar20 = lVar20 + lVar19;
                                } while (iVar11 != lVar26);
                              }
                            }
                            piVar24 = (int16 *)__ckd_malloc__((long)pbVar15->n_sen * 2,
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                                  ,0x1dd);
                            pbVar15->cd2cisen = piVar24;
                            piVar24 = (int16 *)__ckd_malloc__((long)pbVar15->n_sen * 2,
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                                  ,0x1de);
                            pbVar15->sen2cimap = piVar24;
                            iVar11 = pbVar15->n_ci_sen;
                            if ((long)iVar11 < 1) {
                              uVar25 = 0;
                            }
                            else {
                              piVar9 = pbVar15->cd2cisen;
                              uVar25 = 0;
                              do {
                                piVar9[uVar25] = (int16)uVar25;
                                uVar25 = uVar25 + 1;
                              } while ((long)iVar11 != uVar25);
                            }
                            uVar12 = *local_50;
                            if ((int)(uint)uVar25 < (int)uVar12) {
                              memset(pbVar15->cd2cisen + (uVar25 & 0xffffffff),0xff,
                                     (ulong)(~(uint)uVar25 + uVar12) * 2 + 2);
                            }
                            if (0 < (int)uVar12) {
                              memset(piVar24,0xff,(ulong)uVar12 * 2);
                            }
                            iVar11 = *local_58;
                            if (0 < iVar11) {
                              uVar25 = 0;
                              do {
                                local_50 = (int32 *)(uVar25 * 3);
                                local_60 = (int32 *)(long)pbVar15->phone[uVar25].ssid;
                                lVar19 = 0;
                                while( true ) {
                                  uVar12 = *local_48;
                                  if (uVar12 == 0) {
                                    uVar12 = (uint)pbVar15->sseq_len
                                                   [(&pbVar15->phone->ssid)[(long)local_50]];
                                  }
                                  if ((int)uVar12 <= lVar19) break;
                                  uVar12 = (uint)uVar25;
                                  if ((long)pbVar15->n_ciphone <= (long)uVar25) {
                                    uVar12 = (uint)*(byte *)((long)&pbVar15->phone->info +
                                                            (long)local_50 * 4 + 1);
                                  }
                                  uVar4 = pbVar15->sseq[(long)local_60][lVar19];
                                  piVar24 = pbVar15->sen2cimap;
                                  if (piVar24[uVar4] == -1) {
                                    piVar24[uVar4] = (int16)uVar12;
                                  }
                                  if (uVar12 != (int)piVar24[uVar4]) {
                                    err_msg(ERR_WARN,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                            ,499,
                                            "Senone %d is shared between multiple base phones\n");
                                  }
                                  uVar13 = *local_48;
                                  if (uVar13 == 0) {
                                    uVar13 = (uint)pbVar15->sseq_len[pbVar15->phone[uVar12].ssid];
                                  }
                                  if ((int)uVar13 < lVar19) {
                                    err_msg(ERR_WARN,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                            ,0x1f7,"CD phone %d has fewer states than CI phone %d\n"
                                            ,uVar25 & 0xffffffff,(ulong)uVar12);
                                  }
                                  else {
                                    pbVar15->cd2cisen[uVar4] =
                                         pbVar15->sseq[pbVar15->phone[uVar12].ssid][lVar19];
                                  }
                                  lVar19 = lVar19 + 1;
                                }
                                uVar25 = uVar25 + 1;
                                iVar11 = *local_58;
                              } while ((long)uVar25 < (long)iVar11);
                            }
                            iVar14 = bin_mdef_ciphone_id(pbVar15,"SIL");
                            pbVar15->sil = iVar14;
                            err_msg(ERR_INFO,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                    ,0x204,
                                    "%d CI-phone, %d CD-phone, %d emitstate/phone, %d CI-sen, %d Sen, %d Sen-Seq\n"
                                    ,(ulong)(uint)pbVar15->n_ciphone,
                                    (ulong)(uint)(iVar11 - pbVar15->n_ciphone),
                                    (ulong)(uint)pbVar15->n_emit_state,
                                    (ulong)(uint)pbVar15->n_ci_sen,(ulong)(uint)pbVar15->n_sen,
                                    (ulong)(uint)pbVar15->n_sseq);
                            goto LAB_00120446;
                          }
                          fclose(__stream);
                          ckd_free(pbVar15);
                          pcVar21 = "&m->sil";
                          lVar19 = 0x18d;
                        }
                        else {
                          fclose(__stream);
                          ckd_free(pbVar15);
                          pcVar21 = "&m->n_cd_tree";
                          lVar19 = 0x18c;
                        }
                      }
                      else {
                        fclose(__stream);
                        ckd_free(pbVar15);
                        pcVar21 = "&m->n_ctx";
                        lVar19 = 0x18b;
                      }
                    }
                    else {
                      fclose(__stream);
                      ckd_free(pbVar15);
                      pcVar21 = "&m->n_sseq";
                      lVar19 = 0x18a;
                    }
                  }
                  else {
                    fclose(__stream);
                    ckd_free(pbVar15);
                    pcVar21 = "&m->n_tmat";
                    lVar19 = 0x189;
                  }
                }
                else {
                  fclose(__stream);
                  ckd_free(pbVar15);
                  pcVar21 = "&m->n_sen";
                  lVar19 = 0x188;
                }
              }
              else {
                fclose(__stream);
                ckd_free(pbVar15);
                pcVar21 = "&m->n_ci_sen";
                lVar19 = 0x187;
              }
            }
            else {
              fclose(__stream);
              ckd_free(pbVar15);
              pcVar21 = "&m->n_emit_state";
              lVar19 = 0x186;
            }
          }
          else {
            fclose(__stream);
            ckd_free(pbVar15);
            pcVar21 = "&m->n_phone";
            lVar19 = 0x185;
          }
        }
        else {
          fclose(__stream);
          ckd_free(pbVar15);
          pcVar21 = "&m->n_ciphone";
          lVar19 = 0x184;
        }
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                       ,lVar19,"Failed to read %s from %s\n",pcVar21,filename);
        return (bin_mdef_t *)0x0;
      }
      fclose(__stream);
      pcVar21 = "Failed to read header length from %s\n";
      lVar19 = 0x16e;
    }
    else {
      fclose(__stream);
      pcVar21 = "Failed to read version from %s\n";
      lVar19 = 0x161;
    }
  }
  else {
    fclose(__stream);
    pcVar21 = "Failed to read byte-order marker from %s\n";
    lVar19 = 0x157;
  }
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                 ,lVar19,pcVar21,filename);
  return (bin_mdef_t *)0x0;
}

Assistant:

bin_mdef_t *
bin_mdef_read(ps_config_t *config, const char *filename)
{
    bin_mdef_t *m;
    FILE *fh;
    size_t tree_start;
    int32 val, i, do_mmap, swap;
    long pos, end;
    int32 *sseq_size;

    /* Try to read it as text first. */
    if ((m = bin_mdef_read_text(config, filename)) != NULL)
        return m;

    E_INFO("Reading binary model definition: %s\n", filename);
    if ((fh = fopen(filename, "rb")) == NULL)
        return NULL;

    if (fread(&val, 4, 1, fh) != 1) {
        fclose(fh);
        E_ERROR_SYSTEM("Failed to read byte-order marker from %s\n",
                       filename);
        return NULL;
    }
    swap = 0;
    if (val == BIN_MDEF_OTHER_ENDIAN) {
        swap = 1;
        E_INFO("Must byte-swap %s\n", filename);
    }
    if (fread(&val, 4, 1, fh) != 1) {
        fclose(fh);
        E_ERROR_SYSTEM("Failed to read version from %s\n", filename);
        return NULL;
    }
    if (swap)
        SWAP_INT32(&val);
    if (val > BIN_MDEF_FORMAT_VERSION) {
        E_ERROR("File format version %d for %s is newer than library\n",
                val, filename);
        fclose(fh);
        return NULL;
    }
    if (fread(&val, 4, 1, fh) != 1) {
        fclose(fh);
        E_ERROR_SYSTEM("Failed to read header length from %s\n", filename);
        return NULL;
    }
    if (swap)
        SWAP_INT32(&val);
    /* Skip format descriptor. */
    fseek(fh, val, SEEK_CUR);

    /* Finally allocate it. */
    m = ckd_calloc(1, sizeof(*m));
    m->refcnt = 1;

    /* Check these, to make gcc/glibc shut up. */
#define FREAD_SWAP32_CHK(dest)                                          \
    if (fread((dest), 4, 1, fh) != 1) {                                 \
        fclose(fh);                                                     \
        ckd_free(m);                                                    \
        E_ERROR_SYSTEM("Failed to read %s from %s\n", #dest, filename); \
        return NULL;                                                    \
    }                                                                   \
    if (swap) SWAP_INT32(dest);
    
    FREAD_SWAP32_CHK(&m->n_ciphone);
    FREAD_SWAP32_CHK(&m->n_phone);
    FREAD_SWAP32_CHK(&m->n_emit_state);
    FREAD_SWAP32_CHK(&m->n_ci_sen);
    FREAD_SWAP32_CHK(&m->n_sen);
    FREAD_SWAP32_CHK(&m->n_tmat);
    FREAD_SWAP32_CHK(&m->n_sseq);
    FREAD_SWAP32_CHK(&m->n_ctx);
    FREAD_SWAP32_CHK(&m->n_cd_tree);
    FREAD_SWAP32_CHK(&m->sil);

    /* CI names are first in the file. */
    m->ciname = ckd_calloc(m->n_ciphone, sizeof(*m->ciname));

    /* Decide whether to read in the whole file or mmap it. */
    do_mmap = config ? ps_config_bool(config, "mmap") : TRUE;
    if (swap) {
        E_WARN("-mmap specified, but mdef is other-endian.  Will not memory-map.\n");
        do_mmap = FALSE;
    } 
    /* Actually try to mmap it. */
    if (do_mmap) {
        m->filemap = mmio_file_read(filename);
        if (m->filemap == NULL)
            do_mmap = FALSE;
    }
    pos = ftell(fh);
    if (do_mmap) {
        /* Get the base pointer from the memory map. */
        m->ciname[0] = (char *)mmio_file_ptr(m->filemap) + pos;
        /* Success! */
        m->alloc_mode = BIN_MDEF_ON_DISK;
    }
    else {
        /* Read everything into memory. */
        m->alloc_mode = BIN_MDEF_IN_MEMORY;
        fseek(fh, 0, SEEK_END);
        end = ftell(fh);
        fseek(fh, pos, SEEK_SET);
        m->ciname[0] = ckd_malloc(end - pos);
        if (fread(m->ciname[0], 1, end - pos, fh) != (size_t)(end - pos))
            E_FATAL("Failed to read %d bytes of data from %s\n", end - pos, filename);
    }

    for (i = 1; i < m->n_ciphone; ++i)
        m->ciname[i] = m->ciname[i - 1] + strlen(m->ciname[i - 1]) + 1;

    /* Skip past the padding. */
    tree_start =
        m->ciname[i - 1] + strlen(m->ciname[i - 1]) + 1 - m->ciname[0];
    tree_start = (tree_start + 3) & ~3;
    m->cd_tree = (cd_tree_t *) (m->ciname[0] + tree_start);
    if (swap) {
        for (i = 0; i < m->n_cd_tree; ++i) {
            SWAP_INT16(&m->cd_tree[i].ctx);
            SWAP_INT16(&m->cd_tree[i].n_down);
            SWAP_INT32(&m->cd_tree[i].c.down);
        }
    }
    m->phone = (mdef_entry_t *) (m->cd_tree + m->n_cd_tree);
    if (swap) {
        for (i = 0; i < m->n_phone; ++i) {
            SWAP_INT32(&m->phone[i].ssid);
            SWAP_INT32(&m->phone[i].tmat);
        }
    }
    sseq_size = (int32 *) (m->phone + m->n_phone);
    if (swap)
        SWAP_INT32(sseq_size);
    m->sseq = ckd_calloc(m->n_sseq, sizeof(*m->sseq));
    m->sseq[0] = (uint16 *) (sseq_size + 1);
    if (swap) {
        for (i = 0; i < *sseq_size; ++i)
            SWAP_INT16(m->sseq[0] + i);
    }
    if (m->n_emit_state) {
        for (i = 1; i < m->n_sseq; ++i)
            m->sseq[i] = m->sseq[0] + i * m->n_emit_state;
    }
    else {
        m->sseq_len = (uint8 *) (m->sseq[0] + *sseq_size);
        for (i = 1; i < m->n_sseq; ++i)
            m->sseq[i] = m->sseq[i - 1] + m->sseq_len[i - 1];
    }

    /* Now build the CD-to-CI mappings using the senone sequences.
     * This is the only really accurate way to do it, though it is
     * still inaccurate in the case of heterogeneous topologies or
     * cross-state tying. */
    m->cd2cisen = (int16 *) ckd_malloc(m->n_sen * sizeof(*m->cd2cisen));
    m->sen2cimap = (int16 *) ckd_malloc(m->n_sen * sizeof(*m->sen2cimap));

    /* Default mappings (identity, none) */
    for (i = 0; i < m->n_ci_sen; ++i)
        m->cd2cisen[i] = i;
    for (; i < m->n_sen; ++i)
        m->cd2cisen[i] = -1;
    for (i = 0; i < m->n_sen; ++i)
        m->sen2cimap[i] = -1;
    for (i = 0; i < m->n_phone; ++i) {
        int32 j, ssid = m->phone[i].ssid;

        for (j = 0; j < bin_mdef_n_emit_state_phone(m, i); ++j) {
            int s = bin_mdef_sseq2sen(m, ssid, j);
            int ci = bin_mdef_pid2ci(m, i);
            /* Take the first one and warn if we have cross-state tying. */
            if (m->sen2cimap[s] == -1)
                m->sen2cimap[s] = ci;
            if (m->sen2cimap[s] != ci)
                E_WARN
                    ("Senone %d is shared between multiple base phones\n",
                     s);

            if (j > bin_mdef_n_emit_state_phone(m, ci))
                E_WARN("CD phone %d has fewer states than CI phone %d\n",
                       i, ci);
            else
                m->cd2cisen[s] =
                    bin_mdef_sseq2sen(m, m->phone[ci].ssid, j);
        }
    }

    /* Set the silence phone. */
    m->sil = bin_mdef_ciphone_id(m, S3_SILENCE_CIPHONE);

    E_INFO
        ("%d CI-phone, %d CD-phone, %d emitstate/phone, %d CI-sen, %d Sen, %d Sen-Seq\n",
         m->n_ciphone, m->n_phone - m->n_ciphone, m->n_emit_state,
         m->n_ci_sen, m->n_sen, m->n_sseq);
    fclose(fh);
    return m;
}